

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O3

void __thiscall Datatype::printRaw(Datatype *this,ostream *s)

{
  size_type sVar1;
  
  sVar1 = (this->name)._M_string_length;
  if (sVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(s,(this->name)._M_dataplus._M_p,sVar1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"unkbyte",7);
  *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) =
       *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::ostream::operator<<(s,this->size);
  return;
}

Assistant:

void Datatype::printRaw(ostream &s) const

{
  if (name.size()>0)
    s << name;
  else
    s << "unkbyte" << dec << size;
}